

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

uint64_t modinv2p64(uint64_t x)

{
  uint64_t uVar1;
  int iVar2;
  bool bVar3;
  
  if ((x & 1) != 0) {
    uVar1 = 1;
    iVar2 = 6;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      uVar1 = uVar1 * (2 - uVar1 * x);
    }
    return uVar1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x2e5,"test condition failed: x & 1");
  abort();
}

Assistant:

static uint64_t modinv2p64(uint64_t x) {
    /* If w = 1/x mod 2^(2^L), then w*(2 - w*x) = 1/x mod 2^(2^(L+1)). See
     * Hacker's Delight second edition, Henry S. Warren, Jr., pages 245-247 for
     * why. Start with L=0, for which it is true for every odd x that
     * 1/x=1 mod 2. Iterating 6 times gives us 1/x mod 2^64. */
    int l;
    uint64_t w = 1;
    CHECK(x & 1);
    for (l = 0; l < 6; ++l) w *= (2 - w*x);
    return w;
}